

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O0

void Sim_SimulateCollected(Vec_Str_t *vTargets,Vec_Ptr_t *vNodes,Vec_Ptr_t *vField)

{
  byte bVar1;
  int iVar2;
  int nWords;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  void *pvVar3;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  int fCompl;
  int Phase;
  int k;
  int i;
  uint *pUnsignedF;
  uint *pUnsigned;
  Vec_Ptr_t *vSims;
  Abc_Obj_t *pDisproved;
  Abc_Obj_t *pFanin1;
  Abc_Obj_t *pFanin0;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vField_local;
  Vec_Ptr_t *vNodes_local;
  Vec_Str_t *vTargets_local;
  
  iVar2 = Vec_PtrSize(vField);
  nWords = Vec_PtrSize(vNodes);
  p = Sim_UtilInfoAlloc(iVar2,nWords,0);
  for (Phase = 0; iVar2 = Vec_PtrSize(vField), Phase < iVar2; Phase = Phase + 1) {
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vField,Phase);
    iVar2 = Abc_ObjIsCi(pObj_00);
    if (iVar2 == 0) {
      iVar2 = Abc_ObjIsCo(pObj_00);
      if (iVar2 == 0) {
        Abc_ObjFanin0(pObj_00);
        Abc_ObjFanin1(pObj_00);
      }
      else {
        pvVar3 = Vec_PtrEntry(p,Phase);
        pAVar4 = Abc_ObjFanin0(pObj_00);
        pvVar5 = Vec_PtrEntry(p,(pAVar4->field_5).iData);
        iVar2 = Abc_ObjFaninC0(pObj_00);
        if (iVar2 == 0) {
          for (fCompl = 0; iVar2 = Vec_PtrSize(vNodes), fCompl < iVar2; fCompl = fCompl + 1) {
            *(undefined4 *)((long)pvVar3 + (long)fCompl * 4) =
                 *(undefined4 *)((long)pvVar5 + (long)fCompl * 4);
          }
        }
        else {
          for (fCompl = 0; iVar2 = Vec_PtrSize(vNodes), fCompl < iVar2; fCompl = fCompl + 1) {
            *(uint *)((long)pvVar3 + (long)fCompl * 4) =
                 *(uint *)((long)pvVar5 + (long)fCompl * 4) ^ 0xffffffff;
          }
        }
        for (fCompl = 0; iVar2 = Vec_PtrSize(vNodes), fCompl < iVar2; fCompl = fCompl + 1) {
          if (*(int *)((long)pvVar3 + (long)fCompl * 4) != (pObj_00->field_5).iData) {
            pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,fCompl);
            iVar2 = Abc_ObjIsComplement(pAVar4);
            pAVar4 = Abc_ObjRegular(pAVar4);
            bVar1 = Vec_StrEntry(vTargets,pAVar4->Id);
            if (iVar2 == 0) {
              bVar1 = bVar1 & 1;
            }
            else {
              bVar1 = bVar1 & 2;
            }
            Vec_StrWriteEntry(vTargets,pAVar4->Id,bVar1);
          }
        }
      }
    }
    else {
      pvVar3 = Vec_PtrEntry(p,Phase);
      for (fCompl = 0; iVar2 = Vec_PtrSize(vNodes), fCompl < iVar2; fCompl = fCompl + 1) {
        *(int *)((long)pvVar3 + (long)fCompl * 4) = (pObj_00->field_6).iTemp;
      }
    }
  }
  return;
}

Assistant:

void Sim_SimulateCollected( Vec_Str_t * vTargets, Vec_Ptr_t * vNodes, Vec_Ptr_t * vField )
{
    Abc_Obj_t * pObj, * pFanin0, * pFanin1, * pDisproved;
    Vec_Ptr_t * vSims;
    unsigned * pUnsigned, * pUnsignedF;
    int i, k, Phase, fCompl;
    // get simulation info
    vSims = Sim_UtilInfoAlloc( Vec_PtrSize(vField), Vec_PtrSize(vNodes), 0 );
    // simulate the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vField, pObj, i )
    {
        if ( Abc_ObjIsCi(pObj) )
        {
            pUnsigned = (unsigned *)Vec_PtrEntry( vSims, i );
            for ( k = 0; k < Vec_PtrSize(vNodes); k++ )
                pUnsigned[k] = (unsigned)(ABC_PTRUINT_T)pObj->pCopy;
            continue;
        }
        if ( Abc_ObjIsCo(pObj) )
        {
            pUnsigned  = (unsigned *)Vec_PtrEntry( vSims, i );
            pUnsignedF = (unsigned *)Vec_PtrEntry( vSims, (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pData );
            if ( Abc_ObjFaninC0(pObj) )
                for ( k = 0; k < Vec_PtrSize(vNodes); k++ )
                    pUnsigned[k] = ~pUnsignedF[k];
            else
                for ( k = 0; k < Vec_PtrSize(vNodes); k++ )
                    pUnsigned[k] = pUnsignedF[k];
            // update targets
            for ( k = 0; k < Vec_PtrSize(vNodes); k++ )
            {
                if ( pUnsigned[k] == (unsigned)(ABC_PTRUINT_T)pObj->pData )
                    continue;
                pDisproved = (Abc_Obj_t *)Vec_PtrEntry( vNodes, k );
                fCompl = Abc_ObjIsComplement(pDisproved);
                pDisproved = Abc_ObjRegular(pDisproved);
                Phase = Vec_StrEntry( vTargets, pDisproved->Id );
                if ( fCompl )
                    Phase = (Phase & 2);
                else
                    Phase = (Phase & 1);
                Vec_StrWriteEntry( vTargets, pDisproved->Id, (char)Phase );
            }
            continue;
        }
        // simulate the node
        pFanin0 = Abc_ObjFanin0(pObj);
        pFanin1 = Abc_ObjFanin1(pObj);
    }
}